

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::class_<kratos::StatementType>::dealloc(value_and_holder *v_h)

{
  byte *pbVar1;
  void **ppvVar2;
  instance *piVar3;
  ulong uVar4;
  align_val_t aVar5;
  byte bVar6;
  undefined1 local_30 [8];
  error_scope scope;
  
  PyErr_Fetch(local_30,&scope,&scope.value);
  bVar6 = v_h->inst->field_0x30;
  if ((bVar6 & 2) == 0) {
    bVar6 = (v_h->inst->field_1).nonsimple.status[v_h->index] & 1;
  }
  else {
    bVar6 = bVar6 & 4;
  }
  ppvVar2 = v_h->vh;
  if (bVar6 == 0) {
    uVar4 = v_h->type->type_size;
    aVar5 = v_h->type->type_align;
    if (aVar5 < 0x11) {
      operator_delete(*ppvVar2,uVar4);
    }
    else {
      operator_delete(*ppvVar2,uVar4,aVar5);
    }
  }
  else {
    if (ppvVar2[1] != (void *)0x0) {
      operator_delete(ppvVar2[1],4);
    }
    ppvVar2[1] = (void *)0x0;
    piVar3 = v_h->inst;
    if ((piVar3->field_0x30 & 2) == 0) {
      pbVar1 = (piVar3->field_1).nonsimple.status + v_h->index;
      *pbVar1 = *pbVar1 & 0xfe;
    }
    else {
      piVar3->field_0x30 = piVar3->field_0x30 & 0xfb;
    }
  }
  *v_h->vh = (void *)0x0;
  error_scope::~error_scope((error_scope *)local_30);
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        // We could be deallocating because we are cleaning up after a Python exception.
        // If so, the Python error indicator will be set. We need to clear that before
        // running the destructor, in case the destructor code calls more Python.
        // If we don't, the Python API will exit with an exception, and pybind11 will
        // throw error_already_set from the C++ destructor which is forbidden and triggers
        // std::terminate().
        error_scope scope;
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }